

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodegenerator.cpp
# Opt level: O3

string * stackjit::ByteCodeGenerator::escapedString(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  long *plVar5;
  size_type *psVar6;
  size_type sVar7;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      cVar1 = pcVar3[sVar7];
      if ((cVar1 == '\\') || (cVar1 == '\"')) {
        std::__cxx11::string::append((char *)&local_70);
      }
      std::__cxx11::string::push_back((char)&local_70);
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  std::operator+(&local_50,"\"",&local_70);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar4 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ByteCodeGenerator::escapedString(std::string str) {
		std::string res = "";

		for (char c : str) {
			if (c == '"' || c == '\\') {
				res += "\\";
			}

			res += c;
		}

		return "\"" + res + "\"";
	}